

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteAiger.c
# Opt level: O1

int fprintfBz2Aig(bz2file *b,char *fmt,...)

{
  char in_AL;
  int iVar1;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int bzError;
  va_list ap;
  int local_10c;
  undefined8 local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (b->b == (BZFILE *)0x0) {
    local_f8 = local_e8;
    local_100 = &stack0x00000008;
    local_108 = 0x3000000010;
    iVar1 = vfprintf((FILE *)b->f,fmt,&local_108);
    return iVar1;
  }
  do {
    local_108 = 0x3000000010;
    local_100 = &stack0x00000008;
    local_f8 = local_e8;
    iVar1 = vsnprintf(b->buf,(long)b->nBytesMax,fmt,&local_108);
    b->nBytes = iVar1;
    if (iVar1 < 0) {
LAB_0033a94b:
      iVar1 = b->nBytesMax * 2;
    }
    else {
      if (iVar1 < b->nBytesMax) {
        BZ2_bzWrite(&local_10c,b->b,b->buf,iVar1);
        if (local_10c == -6) {
          fwrite("Ioa_WriteBlif(): I/O error writing to compressed stream.\n",0x39,1,_stdout);
          return -1;
        }
        return b->nBytes;
      }
      if (iVar1 < 0) goto LAB_0033a94b;
      iVar1 = iVar1 + 1;
    }
    b->nBytesMax = iVar1;
    if (b->buf == (char *)0x0) {
      pcVar2 = (char *)malloc((long)iVar1);
    }
    else {
      pcVar2 = (char *)realloc(b->buf,(long)iVar1);
    }
    if (pcVar2 == (char *)0x0) {
      return -1;
    }
    b->buf = pcVar2;
  } while( true );
}

Assistant:

int fprintfBz2Aig( bz2file * b, char * fmt, ... ) {
    if (b->b) {
        char * newBuf;
        int bzError;
        va_list ap;
        while (1) {
            va_start(ap,fmt);
            b->nBytes = vsnprintf(b->buf,b->nBytesMax,fmt,ap);
            va_end(ap);
            if (b->nBytes > -1 && b->nBytes < b->nBytesMax)
                break;
            if (b->nBytes > -1)
                b->nBytesMax = b->nBytes + 1;
            else
                b->nBytesMax *= 2;
            if ((newBuf = ABC_REALLOC( char,b->buf,b->nBytesMax )) == NULL)
                return -1;
            else
                b->buf = newBuf;
        }
        BZ2_bzWrite( &bzError, b->b, b->buf, b->nBytes );
        if (bzError == BZ_IO_ERROR) {
            fprintf( stdout, "Ioa_WriteBlif(): I/O error writing to compressed stream.\n" );
            return -1;
        }
        return b->nBytes;
    } else {
        int n;
        va_list ap;
        va_start(ap,fmt);
        n = vfprintf( b->f, fmt, ap);
        va_end(ap);
        return n;
    }
}